

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vbox.cpp
# Opt level: O1

void __thiscall ftxui::VBox::SetBox(VBox *this,Box box)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  long lVar4;
  long *plVar5;
  pointer psVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_> elements;
  allocator_type local_49;
  vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_> local_48;
  
  uVar8 = box._8_8_;
  Node::SetBox(&this->super_Node,box);
  std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>::vector
            (&local_48,
             (long)(this->super_Node).children_.
                   super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->super_Node).children_.
                   super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,&local_49);
  psVar6 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(this->super_Node).children_.
                super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6;
  if (lVar7 != 0) {
    lVar7 = lVar7 >> 4;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar9 = 0;
    do {
      lVar4 = *(long *)((long)&(psVar6->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)
                               ._M_ptr + lVar9);
      uVar1 = *(undefined4 *)(lVar4 + 0x2c);
      uVar2 = *(undefined4 *)(lVar4 + 0x34);
      *(undefined4 *)
       ((long)&(local_48.
                super__Vector_base<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>
                ._M_impl.super__Vector_impl_data._M_start)->min_size + lVar9) =
           *(undefined4 *)(lVar4 + 0x24);
      *(undefined4 *)
       ((long)&(local_48.
                super__Vector_base<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>
                ._M_impl.super__Vector_impl_data._M_start)->flex_grow + lVar9) = uVar1;
      *(undefined4 *)
       ((long)&(local_48.
                super__Vector_base<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>
                ._M_impl.super__Vector_impl_data._M_start)->flex_shrink + lVar9) = uVar2;
      lVar9 = lVar9 + 0x10;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  box_helper::Compute(&local_48,(box.y_max - box.y_min) + 1);
  psVar6 = (this->super_Node).children_.
           super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_Node).children_.
      super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar6) {
    lVar7 = 0;
    uVar10 = 0;
    do {
      iVar3 = *(int *)((long)&(local_48.
                               super__Vector_base<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>
                               ._M_impl.super__Vector_impl_data._M_start)->size + lVar7);
      plVar5 = *(long **)((long)&(psVar6->
                                 super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                         + lVar7);
      (**(code **)(*plVar5 + 0x18))
                (plVar5,box._0_8_,uVar8 & 0xffffffff | (ulong)(((int)uVar8 + iVar3) - 1) << 0x20);
      uVar10 = uVar10 + 1;
      psVar6 = (this->super_Node).children_.
               super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x10;
      uVar8 = (ulong)(uint)(iVar3 + (int)uVar8);
    } while (uVar10 < (ulong)((long)(this->super_Node).children_.
                                    super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4))
    ;
  }
  if (local_48.
      super__Vector_base<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);

    std::vector<box_helper::Element> elements(children_.size());
    for (size_t i = 0; i < children_.size(); ++i) {
      auto& element = elements[i];
      const auto& requirement = children_[i]->requirement();
      element.min_size = requirement.min_y;
      element.flex_grow = requirement.flex_grow_y;
      element.flex_shrink = requirement.flex_shrink_y;
    }
    int target_size = box.y_max - box.y_min + 1;
    box_helper::Compute(&elements, target_size);

    int y = box.y_min;
    for (size_t i = 0; i < children_.size(); ++i) {
      box.y_min = y;
      box.y_max = y + elements[i].size - 1;
      children_[i]->SetBox(box);
      y = box.y_max + 1;
    }
  }